

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O2

jvirt_sarray_ptr
request_virt_sarray(j_common_ptr cinfo,int pool_id,boolean pre_zero,JDIMENSION samplesperrow,
                   JDIMENSION numrows,JDIMENSION maxaccess)

{
  jpeg_memory_mgr *pjVar1;
  jpeg_error_mgr *pjVar2;
  jvirt_sarray_ptr pjVar3;
  
  pjVar1 = cinfo->mem;
  if (pool_id != 1) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0xf;
    (pjVar2->msg_parm).i[0] = pool_id;
    (*cinfo->err->error_exit)(cinfo);
  }
  pjVar3 = (jvirt_sarray_ptr)alloc_small(cinfo,pool_id,0x98);
  pjVar3->mem_buffer = (JSAMPARRAY)0x0;
  pjVar3->rows_in_array = numrows;
  pjVar3->samplesperrow = samplesperrow;
  pjVar3->maxaccess = maxaccess;
  pjVar3->pre_zero = pre_zero;
  pjVar3->b_s_open = 0;
  pjVar3->next = (jvirt_sarray_ptr)pjVar1[1].request_virt_sarray;
  pjVar1[1].request_virt_sarray =
       (_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)pjVar3;
  return pjVar3;
}

Assistant:

METHODDEF(jvirt_sarray_ptr)
request_virt_sarray (j_common_ptr cinfo, int pool_id, boolean pre_zero,
		     JDIMENSION samplesperrow, JDIMENSION numrows,
		     JDIMENSION maxaccess)
/* Request a virtual 2-D sample array */
{
  my_mem_ptr mem = (my_mem_ptr) cinfo->mem;
  jvirt_sarray_ptr result;

  /* Only IMAGE-lifetime virtual arrays are currently supported */
  if (pool_id != JPOOL_IMAGE)
    ERREXIT1(cinfo, JERR_BAD_POOL_ID, pool_id);	/* safety check */

  /* get control block */
  result = (jvirt_sarray_ptr) alloc_small(cinfo, pool_id,
					  SIZEOF(struct jvirt_sarray_control));

  result->mem_buffer = NULL;	/* marks array not yet realized */
  result->rows_in_array = numrows;
  result->samplesperrow = samplesperrow;
  result->maxaccess = maxaccess;
  result->pre_zero = pre_zero;
  result->b_s_open = FALSE;	/* no associated backing-store object */
  result->next = mem->virt_sarray_list; /* add to list of virtual arrays */
  mem->virt_sarray_list = result;

  return result;
}